

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O2

void find_moves(void)

{
  char *pcVar1;
  char **ppcVar2;
  int ***pppiVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int j;
  long lVar9;
  
  calc_adj();
  calc_legal_all();
  pppiVar3 = adj;
  if (start == true) {
    adj[1][6][6] = 1;
    (*pppiVar3)[6][6] = 1;
  }
  full_rack = rack_size == 7;
  std::vector<Move,_std::allocator<Move>_>::clear(&moves);
  lVar7 = 0;
  iVar4 = bsize;
  for (lVar8 = 1; lVar8 <= iVar4; lVar8 = lVar8 + 1) {
    lVar6 = 0;
    for (lVar9 = 1; lVar9 <= iVar4; lVar9 = lVar9 + 1) {
      lVar5 = lVar6;
      if (board[lVar8][lVar9] == '\0') {
        do {
          pcVar1 = board[lVar8] + lVar5;
          lVar5 = lVar5 + -1;
        } while ('\x01' < *pcVar1);
        find_moves_at((int)lVar8,(int)lVar5 + 2,true,false,-1,0);
        lVar5 = lVar7;
        do {
          ppcVar2 = board + lVar5;
          lVar5 = lVar5 + -1;
        } while ('\x01' < (*ppcVar2)[lVar9]);
        find_moves_at((int)lVar5 + 2,(int)lVar9,false,false,-1,0);
        iVar4 = bsize;
      }
      lVar6 = lVar6 + 1;
    }
    lVar7 = lVar7 + 1;
  }
  return;
}

Assistant:

void find_moves() {
    calc_adj();
    calc_legal_all();
    if (start) adj[0][6][6] = adj[1][6][6] = 1;
    full_rack = (rack_size == 7);
    moves.clear();
    for (int i = 1; i <= bsize; i++) {
        for (int j = 1; j <= bsize; j++) {
            if (board[i][j] == 0) { //only look on free squares to avoid redundancy
                int j1 = j;
                while (board[i][--j1] > 1); //go to leftmost taken square on board
                find_moves_at(i, j1 + 1, true);
                int i1 = i;
                while (board[--i1][j] > 1);
                find_moves_at(i1 + 1, j, false);
            }
        }
    }
}